

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::namemorecompile(Forth *this)

{
  bool bVar1;
  uint index;
  size_type sVar2;
  Definition *this_00;
  bool immediate;
  Definition *defn;
  uint nt;
  Forth *this_local;
  
  requireDStackDepth(this,1,"NAME>COMPILE");
  requireDStackAvailable(this,1,"NAME>COMPILE");
  index = ForthStack<unsigned_int>::getTop(&this->dStack);
  sVar2 = std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::
          size(&this->definitions);
  if (index < sVar2) {
    this_00 = getDefinition(this,index);
    bVar1 = Definition::isImmediate(this_00);
    if (bVar1) {
      ForthStack<unsigned_int>::push(&this->dStack,0x14);
    }
    else {
      ForthStack<unsigned_int>::push(&this->dStack,0x15);
    }
  }
  else {
    ForthStack<unsigned_int>::setTop(&this->dStack,0);
    ForthStack<unsigned_int>::push(&this->dStack,0x15);
  }
  return;
}

Assistant:

void namemorecompile(){
			REQUIRE_DSTACK_DEPTH(1, "NAME>COMPILE");
			REQUIRE_DSTACK_AVAILABLE(1, "NAME>COMPILE");
			auto nt=dStack.getTop();
			if(nt>=0 && nt<definitions.size()){
			auto defn=getDefinition(nt);
			auto immediate=defn->isImmediate();
			if(immediate){
				dStack.push(CELL(executeXt));
			} else {
				dStack.push(CELL(compileCommaXt));
			}
			} else {
				dStack.setTop(wrongCommandXt);
				dStack.push(compileCommaXt);
			}
		}